

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall
SoundConfigTab::SoundConfigTab
          (SoundConfigTab *this,MidiConfig *midiConfig,SoundConfig *soundConfig,
          AudioEnumerator *audio,MidiEnumerator *midi,QWidget *parent)

{
  AudioEnumerator *enumerator;
  MidiEnumerator *enumerator_00;
  int iVar1;
  int iVar2;
  DeviceGroup *pDVar3;
  QGroupBox *pQVar4;
  QGridLayout *pQVar5;
  QLabel *pQVar6;
  QSpinBox *pQVar7;
  QComboBox *pQVar8;
  QVBoxLayout *pQVar9;
  Function slot;
  Function slot_00;
  Function slot_01;
  Function slot_02;
  Function slot_03;
  Function slot_04;
  Function slot_05;
  ConnectionType type;
  Object local_388 [8];
  code *local_380;
  undefined8 uStack_378;
  Object *local_370;
  code *local_360;
  undefined8 local_358;
  Object local_350 [8];
  code *local_348;
  undefined8 uStack_340;
  Object *local_338;
  code *local_328;
  undefined8 local_320;
  Object local_318 [8];
  code *local_310;
  undefined8 uStack_308;
  code *local_300;
  undefined8 local_2f8;
  Object local_2f0 [8];
  code *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  Object local_2c8 [8];
  code *local_2c0;
  undefined8 uStack_2b8;
  Object *local_2b0;
  code *local_2a0;
  undefined8 local_298;
  Object local_290 [8];
  code *local_288;
  undefined8 uStack_280;
  Object *local_278;
  code *local_268;
  undefined8 local_260;
  Object local_258 [8];
  code *local_250;
  undefined8 uStack_248;
  Object *local_240;
  code *local_230;
  undefined8 local_228;
  Object local_220 [8];
  code *local_218;
  undefined8 uStack_210;
  Object *local_208;
  code *local_1f8;
  undefined8 local_1f0;
  Object local_1e8 [8];
  code *local_1e0;
  undefined8 uStack_1d8;
  Object *local_1d0;
  code *local_1c0;
  undefined8 local_1b8;
  Object local_1b0 [15];
  anon_class_1_0_00000001 local_1a1;
  undefined1 local_1a0 [7];
  anon_class_1_0_00000001 setupTimeSpinbox;
  QLatin1Char local_17b;
  QChar local_17a;
  QString local_178;
  QString local_160;
  int local_148;
  QFlags<Qt::AlignmentFlag> local_144;
  int i;
  QFlags<Qt::AlignmentFlag> local_13c;
  QVBoxLayout *local_138;
  QVBoxLayout *layout;
  QString local_128;
  QFlags<Qt::AlignmentFlag> local_110;
  QFlags<Qt::AlignmentFlag> local_10c;
  undefined1 local_105;
  QFlags<Qt::WindowType> local_104;
  QString local_100;
  QFlags<Qt::AlignmentFlag> local_e8;
  QFlags<Qt::AlignmentFlag> local_e4;
  undefined1 local_dd;
  QFlags<Qt::WindowType> local_dc;
  QString local_d8;
  QFlags<Qt::AlignmentFlag> local_c0;
  QFlags<Qt::AlignmentFlag> local_bc;
  undefined1 local_b5;
  QFlags<Qt::WindowType> local_b4;
  QString local_b0;
  QGridLayout *local_98;
  QGridLayout *audioLayout;
  QString local_88;
  QGroupBox *local_70;
  QGroupBox *audioGroup;
  QString local_60;
  QWidget *local_38;
  QWidget *parent_local;
  MidiEnumerator *midi_local;
  AudioEnumerator *audio_local;
  SoundConfig *soundConfig_local;
  MidiConfig *midiConfig_local;
  SoundConfigTab *this_local;
  
  local_38 = parent;
  parent_local = (QWidget *)midi;
  midi_local = (MidiEnumerator *)audio;
  audio_local = (AudioEnumerator *)soundConfig;
  soundConfig_local = (SoundConfig *)midiConfig;
  midiConfig_local = (MidiConfig *)this;
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_002d3ff0;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__SoundConfigTab_002d41a0;
  this->mAudioEnumerator = (AudioEnumerator *)midi_local;
  this->mMidiEnumerator = (MidiEnumerator *)parent_local;
  pDVar3 = (DeviceGroup *)operator_new(0x48);
  audioGroup._7_1_ = 1;
  tr(&local_60,"Output device",(char *)0x0,-1);
  DeviceGroup::DeviceGroup(pDVar3,&local_60);
  audioGroup._7_1_ = 0;
  this->mAudioGroup = pDVar3;
  QString::~QString(&local_60);
  pQVar4 = (QGroupBox *)operator_new(0x28);
  audioLayout._7_1_ = 1;
  tr(&local_88,"Output settings",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar4,(QString *)&local_88,(QWidget *)0x0);
  audioLayout._7_1_ = 0;
  QString::~QString(&local_88);
  local_70 = pQVar4;
  pQVar5 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar5,(QWidget *)0x0);
  local_98 = pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  local_b5 = 1;
  tr(&local_b0,"Buffer size",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_b4);
  QLabel::QLabel(pQVar6,(QString *)&local_b0,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_b4.i);
  local_b5 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_bc);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar6,0,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_b0);
  pQVar7 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar7,(QWidget *)0x0);
  pQVar5 = local_98;
  this->mLatencySpin = pQVar7;
  pQVar7 = this->mLatencySpin;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c0);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar7,0,(QFlags_conflict1 *)0x1);
  pQVar5 = local_98;
  pQVar6 = (QLabel *)operator_new(0x28);
  local_dd = 1;
  tr(&local_d8,"Period",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_dc);
  QLabel::QLabel(pQVar6,(QString *)&local_d8,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_dc.i);
  local_dd = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_e4);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar6,1,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_d8);
  pQVar7 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar7,(QWidget *)0x0);
  pQVar5 = local_98;
  this->mPeriodSpin = pQVar7;
  pQVar7 = this->mPeriodSpin;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_e8);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar7,1,(QFlags_conflict1 *)0x1);
  pQVar5 = local_98;
  pQVar6 = (QLabel *)operator_new(0x28);
  local_105 = 1;
  tr(&local_100,"Sample rate",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_104);
  QLabel::QLabel(pQVar6,(QString *)&local_100,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_104.i)
  ;
  local_105 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_10c);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar6,2,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_100);
  pQVar8 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar8,(QWidget *)0x0);
  pQVar5 = local_98;
  this->mSamplerateCombo = pQVar8;
  pQVar8 = this->mSamplerateCombo;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_110);
  QGridLayout::addWidget((QWidget *)pQVar5,(int)pQVar8,2,(QFlags_conflict1 *)0x1);
  QWidget::setLayout((QLayout *)local_70);
  pDVar3 = (DeviceGroup *)operator_new(0x48);
  layout._7_1_ = 1;
  tr(&local_128,"MIDI Input",(char *)0x0,-1);
  DeviceGroup::DeviceGroup(pDVar3,&local_128);
  layout._7_1_ = 0;
  this->mMidiGroup = pDVar3;
  QString::~QString(&local_128);
  QGroupBox::setCheckable(SUB81(this->mMidiGroup,0));
  pDVar3 = this->mMidiGroup;
  MidiConfig::isEnabled((MidiConfig *)soundConfig_local);
  QGroupBox::setChecked(SUB81(pDVar3,0));
  pQVar9 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar9);
  pDVar3 = this->mAudioGroup;
  local_138 = pQVar9;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_13c);
  QBoxLayout::addWidget((QWidget *)pQVar9,(int)pDVar3,(QFlags_conflict1 *)0x0);
  pQVar4 = local_70;
  pQVar9 = local_138;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&i);
  QBoxLayout::addWidget((QWidget *)pQVar9,(int)pQVar4,(QFlags_conflict1 *)0x0);
  pQVar9 = local_138;
  pDVar3 = this->mMidiGroup;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_144);
  QBoxLayout::addWidget((QWidget *)pQVar9,(int)pDVar3,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)local_138);
  QWidget::setLayout((QLayout *)this);
  enumerator = this->mAudioEnumerator;
  pDVar3 = this->mAudioGroup;
  iVar1 = SoundConfig::backendIndex((SoundConfig *)audio_local);
  iVar2 = SoundConfig::deviceIndex((SoundConfig *)audio_local);
  DeviceGroup::init<AudioEnumerator>(pDVar3,enumerator,iVar1,iVar2);
  for (local_148 = 0; local_148 != 7; local_148 = local_148 + 1) {
    pQVar8 = this->mSamplerateCombo;
    tr(&local_178,"%1 Hz",(char *)0x0,-1);
    iVar1 = StandardRates::get((long)local_148);
    QLatin1Char::QLatin1Char(&local_17b,' ');
    QChar::QChar(&local_17a,local_17b);
    QString::arg(&local_160,&local_178,iVar1,0,10,local_17a);
    QVariant::QVariant((QVariant *)local_1a0);
    QComboBox::addItem(pQVar8,&local_160,(QVariant *)local_1a0);
    QVariant::~QVariant((QVariant *)local_1a0);
    QString::~QString(&local_160);
    QString::~QString(&local_178);
  }
  pQVar8 = this->mSamplerateCombo;
  SoundConfig::samplerateIndex((SoundConfig *)audio_local);
  QComboBox::setCurrentIndex((int)pQVar8);
  pQVar7 = this->mLatencySpin;
  SoundConfig::latency((SoundConfig *)audio_local);
  QSpinBox::setValue((int)pQVar7);
  pQVar7 = this->mPeriodSpin;
  SoundConfig::period((SoundConfig *)audio_local);
  QSpinBox::setValue((int)pQVar7);
  SoundConfigTab::anon_class_1_0_00000001::operator()(&local_1a1,this->mLatencySpin,1,500);
  SoundConfigTab::anon_class_1_0_00000001::operator()(&local_1a1,this->mPeriodSpin,1,100);
  enumerator_00 = this->mMidiEnumerator;
  pDVar3 = this->mMidiGroup;
  iVar1 = MidiConfig::backendIndex((MidiConfig *)soundConfig_local);
  iVar2 = MidiConfig::portIndex((MidiConfig *)soundConfig_local);
  DeviceGroup::init<MidiEnumerator>(pDVar3,enumerator_00,iVar1,iVar2);
  pQVar8 = this->mSamplerateCombo;
  local_1c0 = QComboBox::currentIndexChanged;
  local_1b8 = 0;
  local_1d0 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_1e0 = ConfigTab::setDirty<(Config::Category)1>;
  uStack_1d8 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_1b0,(offset_in_QComboBox_to_subr)pQVar8,local_1d0,slot,type);
  QMetaObject::Connection::~Connection((Connection *)local_1b0);
  pQVar7 = this->mLatencySpin;
  local_1f8 = QSpinBox::valueChanged;
  local_1f0 = 0;
  local_208 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QSpinBox_to_subr)QSpinBox::valueChanged);
  local_218 = ConfigTab::setDirty<(Config::Category)1>;
  uStack_210 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(ConfigTab::*)()>
            (local_1e8,(offset_in_QSpinBox_to_subr)pQVar7,local_208,slot_00,type);
  QMetaObject::Connection::~Connection((Connection *)local_1e8);
  pQVar7 = this->mPeriodSpin;
  local_230 = QSpinBox::valueChanged;
  local_228 = 0;
  local_240 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QSpinBox_to_subr)QSpinBox::valueChanged);
  local_250 = ConfigTab::setDirty<(Config::Category)1>;
  uStack_248 = 0;
  QObject::connect<void(QSpinBox::*)(int),void(ConfigTab::*)()>
            (local_220,(offset_in_QSpinBox_to_subr)pQVar7,local_240,slot_01,type);
  QMetaObject::Connection::~Connection((Connection *)local_220);
  pQVar8 = this->mAudioGroup->mApiCombo;
  local_268 = QComboBox::currentIndexChanged;
  local_260 = 0;
  local_278 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_288 = audioApiChanged;
  uStack_280 = 0;
  QObject::connect<void(QComboBox::*)(int),void(SoundConfigTab::*)(int)>
            (local_258,(offset_in_QComboBox_to_subr)pQVar8,local_278,slot_02,type);
  QMetaObject::Connection::~Connection((Connection *)local_258);
  pQVar8 = this->mAudioGroup->mDeviceCombo;
  local_2a0 = QComboBox::currentIndexChanged;
  local_298 = 0;
  local_2b0 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_2c0 = ConfigTab::setDirty<(Config::Category)1>;
  uStack_2b8 = 0;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_290,(offset_in_QComboBox_to_subr)pQVar8,local_2b0,slot_03,type);
  QMetaObject::Connection::~Connection((Connection *)local_290);
  local_2d8 = QAbstractButton::clicked;
  local_2d0 = 0;
  local_2e8 = audioRescan;
  uStack_2e0 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(SoundConfigTab::*)()>
            (local_2c8,(offset_in_QAbstractButton_to_subr)this->mAudioGroup->mRescanButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_2c8);
  local_300 = QGroupBox::toggled;
  local_2f8 = 0;
  local_310 = ConfigTab::setDirty<(Config::Category)8>;
  uStack_308 = 0;
  QObject::connect<void(QGroupBox::*)(bool),void(ConfigTab::*)()>
            (local_2f0,(offset_in_QGroupBox_to_subr)this->mMidiGroup,(Object *)QGroupBox::toggled,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_2f0);
  pQVar8 = this->mMidiGroup->mApiCombo;
  local_328 = QComboBox::currentIndexChanged;
  local_320 = 0;
  local_338 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_348 = midiApiChanged;
  uStack_340 = 0;
  QObject::connect<void(QComboBox::*)(int),void(SoundConfigTab::*)(int)>
            (local_318,(offset_in_QComboBox_to_subr)pQVar8,local_338,slot_04,type);
  QMetaObject::Connection::~Connection((Connection *)local_318);
  pQVar8 = this->mMidiGroup->mDeviceCombo;
  local_360 = QComboBox::currentIndexChanged;
  local_358 = 0;
  local_370 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_380 = ConfigTab::setDirty<(Config::Category)8>;
  uStack_378 = 0;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_350,(offset_in_QComboBox_to_subr)pQVar8,local_370,slot_05,type);
  QMetaObject::Connection::~Connection((Connection *)local_350);
  QObject::connect<void(QAbstractButton::*)(bool),void(SoundConfigTab::*)()>
            (local_388,(offset_in_QAbstractButton_to_subr)this->mMidiGroup->mRescanButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_388);
  return;
}

Assistant:

SoundConfigTab::SoundConfigTab(
    MidiConfig const& midiConfig,
    SoundConfig const& soundConfig,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    ConfigTab(parent),
    mAudioEnumerator(audio),
    mMidiEnumerator(midi)
{

    mAudioGroup = new DeviceGroup(tr("Output device"));

    auto audioGroup = new QGroupBox(tr("Output settings"));
    auto audioLayout = new QGridLayout;

    // row 0, buffer size (latency)
    audioLayout->addWidget(new QLabel(tr("Buffer size")), 0, 0);
    mLatencySpin = new QSpinBox;
    audioLayout->addWidget(mLatencySpin, 0, 1);

    // row 1, period
    audioLayout->addWidget(new QLabel(tr("Period")), 1, 0);
    mPeriodSpin = new QSpinBox;
    audioLayout->addWidget(mPeriodSpin, 1, 1);

    // row 2, samplerate
    audioLayout->addWidget(new QLabel(tr("Sample rate")), 2, 0);
    mSamplerateCombo = new QComboBox;
    audioLayout->addWidget(mSamplerateCombo, 2, 1);

    audioGroup->setLayout(audioLayout);

    mMidiGroup = new DeviceGroup(tr("MIDI Input"));
    mMidiGroup->setCheckable(true);
    mMidiGroup->setChecked(midiConfig.isEnabled());

    auto layout = new QVBoxLayout;
    layout->addWidget(mAudioGroup);
    layout->addWidget(audioGroup);
    layout->addWidget(mMidiGroup);
    layout->addStretch();
    setLayout(layout);


    // settings
    mAudioGroup->init(mAudioEnumerator, soundConfig.backendIndex(), soundConfig.deviceIndex());

    // populate samplerate combo
    for (int i = 0; i != StandardRates::COUNT; ++i) {
        mSamplerateCombo->addItem(tr("%1 Hz").arg(StandardRates::get(i)));
    }

    mSamplerateCombo->setCurrentIndex(soundConfig.samplerateIndex());
    mLatencySpin->setValue(soundConfig.latency());
    mPeriodSpin->setValue(soundConfig.period());

    auto setupTimeSpinbox = [](QSpinBox &spin, int min, int max) {
        spin.setSuffix(tr(" ms"));
        spin.setMinimum(min);
        spin.setMaximum(max);
    };
    setupTimeSpinbox(*mLatencySpin, SoundConfig::MIN_LATENCY, SoundConfig::MAX_LATENCY);
    setupTimeSpinbox(*mPeriodSpin, SoundConfig::MIN_PERIOD, SoundConfig::MAX_PERIOD);

    mMidiGroup->init(mMidiEnumerator, midiConfig.backendIndex(), midiConfig.portIndex());

    // any changes made by the user will mark this tab as "dirty"
    connect(mSamplerateCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mLatencySpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mPeriodSpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);

    connect(mAudioGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::audioApiChanged);
    connect(mAudioGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    lazyconnect(mAudioGroup->mRescanButton, clicked, this, audioRescan);

    lazyconnect(mMidiGroup, toggled, this, setDirty<Config::CategoryMidi>);
    connect(mMidiGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::midiApiChanged);
    connect(mMidiGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategoryMidi>);
    lazyconnect(mMidiGroup->mRescanButton, clicked, this, midiRescan);
}